

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char *b)

{
  byte bVar1;
  char16_t cVar2;
  int iVar3;
  qsizetype qVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  qVar4 = blen;
  if (alen < blen) {
    qVar4 = alen;
  }
  if (qVar4 < 1) {
    qVar4 = 0;
  }
  else {
    lVar5 = 0;
    do {
      cVar2 = a[lVar5];
      uVar7 = (uint)(ushort)cVar2;
      uVar6 = (uint)(int)(short)*(ushort *)
                                 (QUnicodeTables::uc_properties +
                                 (ulong)*(ushort *)
                                         (QUnicodeTables::uc_property_trie +
                                         (ulong)(((ushort)cVar2 & 0x1f) +
                                                (uint)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)((ushort)cVar2 >> 5) * 2)) * 2) * 0x14
                                 + 0xe) >> 1;
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)cVar2 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)cVar2 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        uVar7 = uVar6 + (ushort)cVar2;
      }
      else {
        lVar9 = (long)(short)uVar6;
        if (*(short *)(QUnicodeTables::specialCaseMap + lVar9 * 2) == 1) {
          uVar7 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar9 * 2 + 2);
        }
      }
      bVar1 = b[lVar5];
      uVar6 = (uint)bVar1;
      uVar8 = (uint)(int)(short)*(ushort *)
                                 (QUnicodeTables::uc_properties +
                                 (ulong)*(ushort *)
                                         (QUnicodeTables::uc_property_trie +
                                         (ulong)((bVar1 & 0x1f) +
                                                (uint)*(ushort *)
                                                       (QUnicodeTables::uc_property_trie +
                                                       (ulong)(bVar1 >> 5) * 2)) * 2) * 0x14 + 0xe)
              >> 1;
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((bVar1 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2)
            * 0x14 + 0xe) & 1) == 0) {
        uVar6 = bVar1 + uVar8;
      }
      else {
        lVar9 = (long)(short)uVar8;
        if (*(short *)(QUnicodeTables::specialCaseMap + lVar9 * 2) == 1) {
          uVar6 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar9 * 2 + 2);
        }
      }
      if ((short)uVar7 != (short)uVar6) {
        return (uVar7 & 0xffff) - (uVar6 & 0xffff);
      }
      lVar5 = lVar5 + 1;
    } while (qVar4 != lVar5);
  }
  iVar3 = 1;
  if (qVar4 == alen) {
    iVar3 = -(uint)(qVar4 != blen);
  }
  return iVar3;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char *b)
{
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
        int diff = foldCase(a[i]) - foldCase(char16_t{uchar(b[i])});
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}